

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_queued.c
# Opt level: O3

void libpd_queued_receive_pd_messages(void)

{
  void *pvVar1;
  int len;
  long lVar2;
  code *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  pd_params *p;
  char *pcVar6;
  double dVar7;
  
  pvVar1 = libpd_mainimp.i_queued;
  len = rb_available_to_read(*(ring_buffer **)((long)libpd_mainimp.i_queued + 0x70));
  if (len != 0) {
    rb_read_from_buffer(*(ring_buffer **)((long)pvVar1 + 0x70),(char *)((long)pvVar1 + 0x80),len);
    if (0 < len) {
      pcVar6 = (char *)((long)pvVar1 + 0x80);
      do {
        pcVar4 = pcVar6 + 0x28;
        switch(*(undefined4 *)pcVar6) {
        case 0:
          if (*(code **)((long)libpd_mainimp.i_queued + 0x68) != (code *)0x0) {
            (**(code **)((long)libpd_mainimp.i_queued + 0x68))(pcVar4);
          }
          lVar2 = (long)*(int *)(pcVar6 + 0x20);
          goto LAB_001a86ca;
        case 1:
          if (*libpd_mainimp.i_queued != (code *)0x0) {
            (**libpd_mainimp.i_queued)(*(undefined8 *)(pcVar6 + 8));
          }
          break;
        case 2:
          pcVar3 = *(code **)((long)libpd_mainimp.i_queued + 8);
          if (pcVar3 == (code *)0x0) {
            pcVar3 = *(code **)((long)libpd_mainimp.i_queued + 0x10);
            if (pcVar3 == (code *)0x0) break;
            uVar5 = *(undefined8 *)(pcVar6 + 8);
            dVar7 = (double)*(float *)(pcVar6 + 0x10);
          }
          else {
            uVar5 = *(undefined8 *)(pcVar6 + 8);
            dVar7 = (double)(ulong)*(uint *)(pcVar6 + 0x10);
          }
          (*pcVar3)(dVar7,uVar5);
          break;
        case 3:
          if (*(code **)((long)libpd_mainimp.i_queued + 0x18) != (code *)0x0) {
            (**(code **)((long)libpd_mainimp.i_queued + 0x18))
                      (*(undefined8 *)(pcVar6 + 8),*(undefined8 *)(pcVar6 + 0x18));
          }
          break;
        case 4:
          if (*(code **)((long)libpd_mainimp.i_queued + 0x20) != (code *)0x0) {
            (**(code **)((long)libpd_mainimp.i_queued + 0x20))
                      (*(undefined8 *)(pcVar6 + 8),*(undefined4 *)(pcVar6 + 0x20),pcVar4);
          }
          goto LAB_001a86c2;
        case 5:
          if (*(code **)((long)libpd_mainimp.i_queued + 0x28) != (code *)0x0) {
            (**(code **)((long)libpd_mainimp.i_queued + 0x28))
                      (*(undefined8 *)(pcVar6 + 8),*(undefined8 *)(pcVar6 + 0x18),
                       *(undefined4 *)(pcVar6 + 0x20),pcVar4);
          }
LAB_001a86c2:
          lVar2 = (long)*(int *)(pcVar6 + 0x20) << 4;
LAB_001a86ca:
          pcVar4 = pcVar4 + lVar2;
        }
        pcVar6 = pcVar4;
      } while (pcVar4 < (char *)((long)pvVar1 + (long)len + 0x80));
    }
  }
  return;
}

Assistant:

void libpd_queued_receive_pd_messages() {
  queued_stuff *queued = QUEUEDSTUFF;
  size_t available = rb_available_to_read(queued->pd_receive_buffer);
  if (!available) return;
  rb_read_from_buffer(queued->pd_receive_buffer, queued->temp_buffer, (int)available);
  char *end = queued->temp_buffer + available;
  char *buffer = queued->temp_buffer;
  while (buffer < end) {
    pd_params *p = (pd_params *)buffer;
    buffer += S_PD_PARAMS;
    switch (p->type) {
      case LIBPD_PRINT: {
        receive_print(p, &buffer);
        break;
      }
      case LIBPD_BANG: {
        receive_bang(p, &buffer);
        break;
      }
      case LIBPD_FLOAT: {
        receive_float(p, &buffer);
        break;
      }
      case LIBPD_SYMBOL: {
        receive_symbol(p, &buffer);
        break;
      }
      case LIBPD_LIST: {
        receive_list(p, &buffer);
        break;
      }
      case LIBPD_MESSAGE: {
        receive_message(p, &buffer);
        break;
      }
      default:
        break;
    }
  }
}